

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O2

LabelSymbol * __thiscall PcodeCompile::defineLabel(PcodeCompile *this,string *name)

{
  uint4 i;
  LabelSymbol *this_00;
  
  this_00 = (LabelSymbol *)operator_new(0x40);
  i = this->local_labelcount;
  this->local_labelcount = i + 1;
  LabelSymbol::LabelSymbol(this_00,name,i);
  std::__cxx11::string::~string((string *)name);
  operator_delete(name);
  (*this->_vptr_PcodeCompile[1])(this,this_00);
  return this_00;
}

Assistant:

LabelSymbol *PcodeCompile::defineLabel(string *name)

{ // Create a label symbol
  LabelSymbol *labsym = new LabelSymbol(*name,local_labelcount++);
  delete name;
  addSymbol(labsym);		// Add symbol to local scope
  return labsym;
}